

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
tf::SmallVectorImpl<tf::Node*>::
append<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>>
          (SmallVectorImpl<tf::Node*> *this,
          __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
          in_start,__normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                   in_end)

{
  ulong __n;
  
  __n = (long)in_end._M_current - (long)in_start._M_current;
  if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) < __n) {
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,this + 0x18,
               (*(long *)(this + 8) + __n) - *(long *)this & 0xfffffffffffffff8,8);
  }
  if (in_end._M_current != in_start._M_current) {
    memmove(*(void **)(this + 8),in_start._M_current,__n);
  }
  *(ulong *)(this + 8) = *(long *)(this + 8) + __n;
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }